

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve2right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *b,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *rhs)

{
  int *ridx;
  int *ridx2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  int *piVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  int *forestIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *forest;
  Real a;
  int rsize;
  int n;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  int f;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_190 = b;
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  rsize = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  ridx2 = (rhs->super_IdxSet).idx;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems._24_5_ = 0;
  epsilon.m_backend.data._M_elems[7]._1_3_ = 0;
  epsilon.m_backend.data._M_elems._32_5_ = 0;
  epsilon.m_backend.data._M_elems[9]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,local_190);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    n = (this->ssvec).super_IdxSet.num;
    local_68.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_68.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_68.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_68.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_68.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_68.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_68.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_68.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_68.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_68.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_68.m_backend.exp = epsilon.m_backend.exp;
    local_68.m_backend.neg = epsilon.m_backend.neg;
    local_68.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_68.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar3 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_a8.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_a8.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_a8.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_a8.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_a8.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_a8.m_backend.exp = epsilon.m_backend.exp;
    local_a8.m_backend.neg = epsilon.m_backend.neg;
    local_a8.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_a8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (y->super_IdxSet).idx;
    pnVar5 = (y->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    y->setupStatus = false;
    rhs->setupStatus = false;
    CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::vSolveRight4update2sparse
              (&this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,&local_68,pnVar2,piVar1,pnVar3,ridx,&n,&local_a8,pnVar5,piVar4,
               (rhs->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,ridx2,&rsize,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)0x0,(int *)0x0,(int *)0x0);
    (x->super_IdxSet).num = n;
    x->setupStatus = false;
    (y->super_IdxSet).num = rsize;
    y->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    n = (this->ssvec).super_IdxSet.num;
    local_e8.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_e8.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_e8.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_e8.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_e8.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_e8.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_e8.m_backend.exp = epsilon.m_backend.exp;
    local_e8.m_backend.neg = epsilon.m_backend.neg;
    local_e8.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_e8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar3 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_128.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_128.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_128.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_128.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_128.m_backend.exp = epsilon.m_backend.exp;
    local_128.m_backend.neg = epsilon.m_backend.neg;
    local_128.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_128.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (y->super_IdxSet).idx;
    local_190 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(y->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    y->setupStatus = false;
    rhs->setupStatus = false;
    pnVar5 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    forestIdx = (this->forest).super_IdxSet.idx;
    forest = (this->forest).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::vSolveRight4update2sparse
              (&this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,&local_e8,pnVar2,piVar1,pnVar3,ridx,&n,&local_128,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_190,piVar4,pnVar5,ridx2,&rsize,forest,&f,forestIdx);
    (x->super_IdxSet).num = n;
    x->setupStatus = true;
    (y->super_IdxSet).num = rsize;
    y->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      nullptr, nullptr, nullptr);
      x.setSize(n);
      //      x.forceSetup();
      x.unSetup();
      y.setSize(rsize);
      y.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      forest.altValues(), &f, forest.altIndexMem());
      x.setSize(n);
      x.forceSetup();
      y.setSize(rsize);
      y.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}